

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O1

void CATCH2_INTERNAL_TEST_72(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef message;
  StringRef message_00;
  StringRef message_01;
  StringRef message_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_88;
  string local_78;
  AssertionHandler local_58;
  
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x1dc;
  macroName.m_size = 7;
  macroName.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"(nullhandle <=> test_handle{ 42 }) == std::strong_ordering::less",0x40)
  ;
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message.m_size = local_78._M_string_length;
  message.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x1dd;
  macroName_00.m_size = 7;
  macroName_00.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_00,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"(nullhandle <=> test_handle{}) == std::strong_ordering::equal",0x3d);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_00.m_size = local_78._M_string_length;
  message_00.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x1de;
  macroName_01.m_size = 7;
  macroName_01.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_01,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"(test_handle{ 42 } <=> nullhandle) == std::strong_ordering::greater",
             0x43);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_01.m_size = local_78._M_string_length;
  message_01.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/unique_handle.cpp"
  ;
  local_78._M_string_length = 0x1df;
  macroName_02.m_size = 7;
  macroName_02.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_02,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46e3a7),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"(test_handle{} <=> nullhandle) == std::strong_ordering::equal",0x3d);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_02.m_size = local_78._M_string_length;
  message_02.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }